

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O3

void aom_hadamard_4x4_sse2(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  int16_t *piVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar12;
  short sVar13;
  short sVar14;
  undefined1 auVar11 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  short sVar24;
  short sVar27;
  short sVar28;
  short sVar29;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  short sVar30;
  short sVar39;
  short sVar40;
  short sVar41;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  
  uVar2 = *(undefined8 *)src_diff;
  piVar1 = src_diff + src_stride;
  uVar3 = *(undefined8 *)piVar1;
  uVar4 = *(undefined8 *)(piVar1 + src_stride);
  uVar5 = *(undefined8 *)(piVar1 + src_stride + src_stride);
  auVar31._0_2_ = (short)uVar3 + (short)uVar2;
  sVar7 = (short)((ulong)uVar2 >> 0x10);
  sVar10 = (short)((ulong)uVar3 >> 0x10);
  auVar31._2_2_ = sVar10 + sVar7;
  sVar8 = (short)((ulong)uVar2 >> 0x20);
  sVar12 = (short)((ulong)uVar3 >> 0x20);
  sVar6 = (short)((ulong)uVar3 >> 0x30);
  auVar31._4_2_ = sVar12 + sVar8;
  sVar9 = (short)((ulong)uVar2 >> 0x30);
  auVar31._6_2_ = sVar6 + sVar9;
  auVar31._8_8_ = 0;
  auVar32 = psraw(auVar31,1);
  auVar43._0_2_ = (short)uVar2 - (short)uVar3;
  auVar43._2_2_ = sVar7 - sVar10;
  auVar43._4_2_ = sVar8 - sVar12;
  auVar43._6_2_ = sVar9 - sVar6;
  auVar43._8_8_ = 0;
  auVar11 = psraw(auVar43,1);
  auVar42._0_2_ = (short)uVar5 + (short)uVar4;
  sVar7 = (short)((ulong)uVar4 >> 0x10);
  sVar10 = (short)((ulong)uVar5 >> 0x10);
  auVar42._2_2_ = sVar10 + sVar7;
  sVar8 = (short)((ulong)uVar4 >> 0x20);
  sVar12 = (short)((ulong)uVar5 >> 0x20);
  sVar6 = (short)((ulong)uVar5 >> 0x30);
  auVar42._4_2_ = sVar12 + sVar8;
  sVar9 = (short)((ulong)uVar4 >> 0x30);
  auVar42._6_2_ = sVar6 + sVar9;
  auVar42._8_8_ = 0;
  auVar43 = psraw(auVar42,1);
  auVar15._0_2_ = (short)uVar4 - (short)uVar5;
  auVar15._2_2_ = sVar7 - sVar10;
  auVar15._4_2_ = sVar8 - sVar12;
  auVar15._6_2_ = sVar9 - sVar6;
  auVar15._8_8_ = 0;
  auVar16 = psraw(auVar15,1);
  sVar6 = auVar43._0_2_ + auVar32._0_2_;
  sVar7 = auVar43._2_2_ + auVar32._2_2_;
  sVar8 = auVar43._4_2_ + auVar32._4_2_;
  sVar9 = auVar43._6_2_ + auVar32._6_2_;
  sVar24 = auVar16._0_2_ + auVar11._0_2_;
  sVar27 = auVar16._2_2_ + auVar11._2_2_;
  sVar28 = auVar16._4_2_ + auVar11._4_2_;
  sVar29 = auVar16._6_2_ + auVar11._6_2_;
  sVar30 = auVar32._0_2_ - auVar43._0_2_;
  sVar39 = auVar32._2_2_ - auVar43._2_2_;
  sVar40 = auVar32._4_2_ - auVar43._4_2_;
  sVar41 = auVar32._6_2_ - auVar43._6_2_;
  sVar10 = auVar11._0_2_ - auVar16._0_2_;
  sVar12 = auVar11._2_2_ - auVar16._2_2_;
  sVar13 = auVar11._4_2_ - auVar16._4_2_;
  sVar14 = auVar11._6_2_ - auVar16._6_2_;
  auVar17._0_2_ = sVar7 + sVar6;
  auVar17._2_2_ = sVar27 + sVar24;
  auVar17._4_2_ = sVar39 + sVar30;
  auVar17._6_2_ = sVar12 + sVar10;
  auVar17._8_2_ = sVar7;
  auVar17._10_2_ = sVar27;
  auVar17._12_2_ = sVar39;
  auVar17._14_2_ = sVar12;
  auVar32 = psraw(auVar17,1);
  auVar26._0_2_ = sVar6 - sVar7;
  auVar26._2_2_ = sVar24 - sVar27;
  auVar26._4_2_ = sVar30 - sVar39;
  auVar26._6_2_ = sVar10 - sVar12;
  auVar26._8_2_ = sVar7;
  auVar26._10_2_ = sVar27;
  auVar26._12_2_ = sVar39;
  auVar26._14_2_ = sVar12;
  auVar43 = psraw(auVar26,1);
  auVar25._0_2_ = sVar9 + sVar8;
  auVar25._2_2_ = sVar29 + sVar28;
  auVar25._4_2_ = sVar41 + sVar40;
  auVar25._6_2_ = sVar14 + sVar13;
  auVar25._8_2_ = sVar9;
  auVar25._10_2_ = sVar29;
  auVar25._12_2_ = sVar41;
  auVar25._14_2_ = sVar14;
  auVar26 = psraw(auVar25,1);
  auVar11._0_2_ = sVar8 - sVar9;
  auVar11._2_2_ = sVar28 - sVar29;
  auVar11._4_2_ = sVar40 - sVar41;
  auVar11._6_2_ = sVar13 - sVar14;
  auVar11._8_2_ = sVar9;
  auVar11._10_2_ = sVar29;
  auVar11._12_2_ = sVar41;
  auVar11._14_2_ = sVar14;
  auVar11 = psraw(auVar11,1);
  auVar33._0_2_ = auVar26._0_2_ + auVar32._0_2_;
  sVar14 = auVar26._2_2_ + auVar32._2_2_;
  auVar34._0_4_ = CONCAT22(sVar14,auVar33._0_2_);
  sVar24 = auVar26._4_2_ + auVar32._4_2_;
  auVar35._0_6_ = CONCAT24(sVar24,auVar34._0_4_);
  sVar27 = auVar26._6_2_ + auVar32._6_2_;
  auVar36._0_8_ = CONCAT26(sVar27,auVar35._0_6_);
  auVar37._0_10_ = CONCAT28(auVar26._8_2_ + auVar32._8_2_,auVar36._0_8_);
  auVar38._10_2_ = auVar26._10_2_ + auVar32._10_2_;
  auVar38._0_10_ = auVar37._0_10_;
  sVar28 = auVar11._0_2_ + auVar43._0_2_;
  sVar29 = auVar11._2_2_ + auVar43._2_2_;
  auVar16._10_2_ = sVar29;
  auVar16._8_2_ = sVar28;
  sVar30 = auVar11._4_2_ + auVar43._4_2_;
  auVar16._12_2_ = sVar30;
  sVar39 = auVar11._6_2_ + auVar43._6_2_;
  auVar16._14_2_ = sVar39;
  auVar18._0_2_ = auVar32._0_2_ - auVar26._0_2_;
  sVar10 = auVar32._2_2_ - auVar26._2_2_;
  auVar19._0_4_ = CONCAT22(sVar10,auVar18._0_2_);
  sVar12 = auVar32._4_2_ - auVar26._4_2_;
  auVar20._0_6_ = CONCAT24(sVar12,auVar19._0_4_);
  sVar13 = auVar32._6_2_ - auVar26._6_2_;
  auVar21._0_8_ = CONCAT26(sVar13,auVar20._0_6_);
  auVar22._0_10_ = CONCAT28(auVar32._8_2_ - auVar26._8_2_,auVar21._0_8_);
  auVar23._10_2_ = auVar32._10_2_ - auVar26._10_2_;
  auVar23._0_10_ = auVar22._0_10_;
  sVar6 = auVar43._0_2_ - auVar11._0_2_;
  sVar7 = auVar43._2_2_ - auVar11._2_2_;
  auVar32._10_2_ = sVar7;
  auVar32._8_2_ = sVar6;
  sVar8 = auVar43._4_2_ - auVar11._4_2_;
  auVar32._12_2_ = sVar8;
  sVar9 = auVar43._6_2_ - auVar11._6_2_;
  auVar32._14_2_ = sVar9;
  auVar16._0_8_ = auVar36._0_8_;
  auVar11 = psraw(auVar16,0xf);
  auVar38._12_2_ = sVar27;
  auVar38._14_2_ = auVar11._6_2_;
  auVar37._12_4_ = auVar38._12_4_;
  auVar37._10_2_ = auVar11._4_2_;
  auVar36._10_6_ = auVar37._10_6_;
  auVar36._8_2_ = sVar24;
  auVar35._8_8_ = auVar36._8_8_;
  auVar35._6_2_ = auVar11._2_2_;
  auVar34._6_10_ = auVar35._6_10_;
  auVar34._4_2_ = sVar14;
  auVar33._4_12_ = auVar34._4_12_;
  auVar33._2_2_ = auVar11._0_2_;
  *(undefined1 (*) [16])coeff = auVar33;
  *(short *)(coeff + 4) = sVar28;
  *(short *)((long)coeff + 0x12) = auVar11._8_2_;
  *(short *)(coeff + 5) = sVar29;
  *(short *)((long)coeff + 0x16) = auVar11._10_2_;
  *(short *)(coeff + 6) = sVar30;
  *(short *)((long)coeff + 0x1a) = auVar11._12_2_;
  *(short *)(coeff + 7) = sVar39;
  *(short *)((long)coeff + 0x1e) = auVar11._14_2_;
  auVar32._0_8_ = auVar21._0_8_;
  auVar11 = psraw(auVar32,0xf);
  auVar23._12_2_ = sVar13;
  auVar23._14_2_ = auVar11._6_2_;
  auVar22._12_4_ = auVar23._12_4_;
  auVar22._10_2_ = auVar11._4_2_;
  auVar21._10_6_ = auVar22._10_6_;
  auVar21._8_2_ = sVar12;
  auVar20._8_8_ = auVar21._8_8_;
  auVar20._6_2_ = auVar11._2_2_;
  auVar19._6_10_ = auVar20._6_10_;
  auVar19._4_2_ = sVar10;
  auVar18._4_12_ = auVar19._4_12_;
  auVar18._2_2_ = auVar11._0_2_;
  *(undefined1 (*) [16])(coeff + 8) = auVar18;
  *(short *)(coeff + 0xc) = sVar6;
  *(short *)((long)coeff + 0x32) = auVar11._8_2_;
  *(short *)(coeff + 0xd) = sVar7;
  *(short *)((long)coeff + 0x36) = auVar11._10_2_;
  *(short *)(coeff + 0xe) = sVar8;
  *(short *)((long)coeff + 0x3a) = auVar11._12_2_;
  *(short *)(coeff + 0xf) = sVar9;
  *(short *)((long)coeff + 0x3e) = auVar11._14_2_;
  return;
}

Assistant:

void aom_hadamard_4x4_sse2(const int16_t *src_diff, ptrdiff_t src_stride,
                           tran_low_t *coeff) {
  __m128i src[4];
  src[0] = _mm_loadl_epi64((const __m128i *)src_diff);
  src[1] = _mm_loadl_epi64((const __m128i *)(src_diff += src_stride));
  src[2] = _mm_loadl_epi64((const __m128i *)(src_diff += src_stride));
  src[3] = _mm_loadl_epi64((const __m128i *)(src_diff + src_stride));

  hadamard_col4_sse2(src, 0);
  hadamard_col4_sse2(src, 1);

  store_tran_low(_mm_unpacklo_epi64(src[0], src[1]), coeff);
  coeff += 8;
  store_tran_low(_mm_unpacklo_epi64(src[2], src[3]), coeff);
}